

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof_data.c
# Opt level: O1

void duckdb_je_prof_reset(tsd_t *tsd,size_t lg_sample)

{
  prof_tdata_t **pppVar1;
  byte *pbVar2;
  long *plVar3;
  rtree_ctx_cache_elm_t *prVar4;
  undefined8 *puVar5;
  ulong uVar6;
  void *pvVar7;
  prof_tdata_t *ppVar8;
  long lVar9;
  rtree_leaf_elm_t *prVar10;
  int iVar11;
  rtree_ctx_t *prVar12;
  ulong *puVar13;
  ulong *puVar14;
  ulong uVar15;
  rtree_leaf_elm_t *prVar16;
  prof_tdata_t *ppVar17;
  prof_tdata_t *ppVar18;
  rtree_ctx_cache_elm_t *prVar19;
  rtree_ctx_cache_elm_t *prVar20;
  malloc_mutex_t *tsd_00;
  ulong uVar21;
  prof_tdata_t *ppVar22;
  prof_tdata_tree_t pVar23;
  rtree_leaf_elm_t *prVar24;
  uint uVar25;
  mutex_prof_data_t *data;
  rtree_ctx_t *rtree_ctx;
  rtree_ctx_t *rtree_ctx_00;
  bool bVar26;
  rtree_ctx_t arStack_850 [5];
  malloc_mutex_t *pmStack_48;
  
  iVar11 = pthread_mutex_trylock((pthread_mutex_t *)((long)&duckdb_je_prof_dump_mtx.field_0 + 0x48))
  ;
  if (iVar11 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&duckdb_je_prof_dump_mtx);
    duckdb_je_prof_dump_mtx.field_0.field_0.locked.repr = (atomic_b_t)true;
  }
  duckdb_je_prof_dump_mtx.field_0.field_0.prof_data.n_lock_ops =
       duckdb_je_prof_dump_mtx.field_0.field_0.prof_data.n_lock_ops + 1;
  if (&(duckdb_je_prof_dump_mtx.field_0.field_0.prof_data.prev_owner)->tsd != tsd) {
    duckdb_je_prof_dump_mtx.field_0.witness.link.qre_prev =
         (witness_t *)(duckdb_je_prof_dump_mtx.field_0.field_0.prof_data.n_owner_switches + 1);
    duckdb_je_prof_dump_mtx.field_0.field_0.prof_data.prev_owner = (tsdn_t *)tsd;
  }
  pthread_mutex_trylock((pthread_mutex_t *)((long)&duckdb_je_tdatas_mtx.field_0 + 0x48));
  tsd_00 = &duckdb_je_tdatas_mtx;
  duckdb_je_malloc_mutex_lock_slow(&duckdb_je_tdatas_mtx);
  pmStack_48 = &duckdb_je_tdatas_mtx;
  prVar12 = arStack_850;
  rtree_ctx = arStack_850;
  rtree_ctx_00 = arStack_850;
  arStack_850[0].cache[0].leafkey = (uintptr_t)tdatas.rbt_root;
  if (tdatas.rbt_root == (prof_tdata_t *)0x0) {
    puVar14 = (ulong *)0x0;
    prVar12 = arStack_850;
  }
  else {
    uVar15 = *(ulong *)(lg_sample + 8);
    puVar14 = (ulong *)0x0;
    pVar23 = tdatas;
    do {
      uVar21 = (pVar23.rbt_root)->thr_uid;
      iVar11 = (uint)(uVar15 >= uVar21 && uVar15 != uVar21) - (uint)(uVar15 < uVar21);
      if (iVar11 == 0) {
        uVar21 = *(ulong *)(lg_sample + 0x10);
        uVar6 = (pVar23.rbt_root)->thr_discrim;
        iVar11 = (uint)(uVar21 >= uVar6 && uVar21 != uVar6) - (uint)(uVar21 < uVar6);
      }
      *(int *)((long)prVar12 + 8) = iVar11;
      puVar13 = (ulong *)prVar12;
      if (iVar11 < 0) {
        *(prof_tdata_t **)((long)prVar12 + 0x10) = ((pVar23.rbt_root)->tdata_link).rbn_left;
        bVar26 = true;
      }
      else {
        uVar21 = (ulong)((pVar23.rbt_root)->tdata_link).rbn_right_red & 0xfffffffffffffffe;
        *(ulong *)((long)prVar12 + 0x10) = uVar21;
        bVar26 = true;
        if (iVar11 == 0) {
          *(undefined4 *)((long)prVar12 + 8) = 1;
          puVar14 = (ulong *)prVar12;
          while (uVar21 != 0) {
            *(undefined4 *)(puVar14 + 3) = 0xffffffff;
            uVar21 = *(ulong *)(uVar21 + 0x18);
            puVar14[4] = uVar21;
            puVar14 = puVar14 + 2;
          }
          bVar26 = false;
          puVar13 = puVar14 + 2;
          puVar14 = (ulong *)prVar12;
        }
      }
      prVar12 = (rtree_ctx_t *)puVar13;
      if (!bVar26) break;
      pVar23.rbt_root = (prof_tdata_t *)puVar13[2];
      prVar12 = (rtree_ctx_t *)(puVar13 + 2);
    } while (pVar23.rbt_root != (prof_tdata_t *)0x0);
  }
  puVar13 = (ulong *)((long)prVar12 + -0x10);
  pvVar7 = *(void **)((long)prVar12 + -0x10);
  if (pvVar7 == (void *)lg_sample) {
    pVar23.rbt_root = *(prof_tdata_t **)(lg_sample + 0x18);
    if (pVar23.rbt_root != (prof_tdata_t *)0x0) {
      pppVar1 = &((pVar23.rbt_root)->tdata_link).rbn_right_red;
      *(byte *)pppVar1 = *(byte *)pppVar1 & 0xfe;
      if ((rtree_ctx_t *)puVar13 != arStack_850) {
        if ((int)*(ulong *)((long)prVar12 + -0x18) < 0) {
          uVar15 = *(ulong *)((long)prVar12 + -0x20);
LAB_0119eb5d:
          *(prof_tdata_t **)(uVar15 + 0x18) = pVar23.rbt_root;
          pVar23 = tdatas;
        }
        else {
          uVar15 = *(ulong *)((long)prVar12 + -0x20);
LAB_0119eb47:
          *(ulong *)(uVar15 + 0x20) =
               (ulong)((uint)*(undefined8 *)(uVar15 + 0x20) & 1) | (ulong)pVar23.rbt_root;
          pVar23 = tdatas;
        }
      }
      goto LAB_0119ebdb;
    }
    if ((rtree_ctx_t *)puVar13 == arStack_850) {
      tdatas.rbt_root = (prof_tdata_t *)0x0;
      pVar23.rbt_root = tdatas.rbt_root;
      goto LAB_0119ebdb;
    }
  }
  else {
    uVar15 = *(ulong *)((long)pvVar7 + 0x20);
    uVar21 = (ulong)((uint)*(undefined8 *)(lg_sample + 0x20) & 1);
    *(ulong *)((long)pvVar7 + 0x20) = uVar15 & 0xfffffffffffffffe | uVar21;
    *(undefined8 *)((long)pvVar7 + 0x18) = *(undefined8 *)(lg_sample + 0x18);
    *(ulong *)((long)pvVar7 + 0x20) = *(ulong *)(lg_sample + 0x20) & 0xfffffffffffffffe | uVar21;
    *(ulong *)(lg_sample + 0x20) =
         *(ulong *)(lg_sample + 0x20) & 0xfffffffffffffffe | (ulong)((uint)uVar15 & 1);
    *puVar14 = (ulong)pvVar7;
    *puVar13 = lg_sample;
    if ((rtree_ctx_t *)puVar14 == arStack_850) {
      tdatas.rbt_root = (prof_tdata_t *)*puVar14;
    }
    else if ((int)puVar14[-1] < 0) {
      *(ulong *)(puVar14[-2] + 0x18) = *puVar14;
    }
    else {
      *(ulong *)(puVar14[-2] + 0x20) =
           (ulong)((uint)*(undefined8 *)(puVar14[-2] + 0x20) & 1) | *puVar14;
    }
  }
  if ((*(byte *)(*puVar13 + 0x20) & 1) == 0) {
    *(ulong *)((long)prVar12 + -0x10) = 0;
    if (arStack_850 <= (ulong *)((long)prVar12 + -0x20)) {
      puVar14 = (ulong *)((long)prVar12 + -0x30);
      do {
        ppVar18 = (prof_tdata_t *)puVar14[4];
        if (-1 < (int)puVar14[3]) {
          uVar15 = puVar14[2];
          ppVar8 = *(prof_tdata_t **)(uVar15 + 0x18);
          uVar21 = (ulong)((uint)*(undefined8 *)(uVar15 + 0x20) & 1);
          *(ulong *)(uVar15 + 0x20) = uVar21 | (ulong)ppVar18;
          ppVar17 = (ppVar8->tdata_link).rbn_right_red;
          pVar23.rbt_root = ppVar8;
          if (((ulong)ppVar17 & 1) == 0) {
            if (uVar21 == 0 && ((ulong)ppVar18 & 1) == 0) {
              ppVar18 = (ppVar8->tdata_link).rbn_left;
              if ((ppVar18 == (prof_tdata_t *)0x0) ||
                 (ppVar22 = (ppVar18->tdata_link).rbn_right_red, ((ulong)ppVar22 & 1) == 0)) {
                (ppVar8->tdata_link).rbn_right_red = (prof_tdata_t *)((ulong)ppVar17 | 1);
                goto LAB_0119e94e;
              }
              (ppVar18->tdata_link).rbn_right_red =
                   (prof_tdata_t *)((ulong)ppVar22 & 0xfffffffffffffffe);
              ppVar18 = (ppVar8->tdata_link).rbn_right_red;
              *(ulong *)(uVar15 + 0x18) = (ulong)ppVar18 & 0xfffffffffffffffe;
              (ppVar8->tdata_link).rbn_right_red = (prof_tdata_t *)((uint)ppVar18 & 1 | uVar15);
              if ((rtree_ctx_t *)(puVar14 + 2) == arStack_850) goto LAB_0119ebdb;
            }
            else {
              ppVar22 = (ppVar8->tdata_link).rbn_left;
              if ((ppVar22 == (prof_tdata_t *)0x0) ||
                 (((ulong)(ppVar22->tdata_link).rbn_right_red & 1) == 0)) {
                (ppVar8->tdata_link).rbn_right_red = (prof_tdata_t *)((ulong)ppVar17 | 1);
                *(byte *)(uVar15 + 0x20) = *(byte *)(uVar15 + 0x20) & 0xfe;
                pVar23 = tdatas;
                goto LAB_0119ebdb;
              }
              *(ulong *)(uVar15 + 0x20) = (ulong)ppVar18 & 0xfffffffffffffffe;
              pppVar1 = &(ppVar8->tdata_link).rbn_right_red;
              *(byte *)pppVar1 = *(byte *)pppVar1 | 1;
              pppVar1 = &(ppVar22->tdata_link).rbn_right_red;
              *(byte *)pppVar1 = *(byte *)pppVar1 & 0xfe;
              ppVar18 = (ppVar8->tdata_link).rbn_right_red;
              *(ulong *)(uVar15 + 0x18) = (ulong)ppVar18 & 0xfffffffffffffffe;
              (ppVar8->tdata_link).rbn_right_red = (prof_tdata_t *)((uint)ppVar18 & 1 | uVar15);
            }
          }
          else {
            lVar9 = *(long *)(((ulong)ppVar17 & 0xfffffffffffffffe) + 0x18);
            if ((lVar9 == 0) || ((*(ulong *)(lVar9 + 0x20) & 1) == 0)) {
              pbVar2 = (byte *)(((ulong)ppVar17 & 0xfffffffffffffffe) + 0x20);
              *pbVar2 = *pbVar2 | 1;
              *(ulong *)(uVar15 + 0x18) =
                   (ulong)(ppVar8->tdata_link).rbn_right_red & 0xfffffffffffffffe;
              (ppVar8->tdata_link).rbn_right_red = (prof_tdata_t *)(uVar15 & 0xfffffffffffffffe);
            }
            else {
              *(ulong *)(lVar9 + 0x20) = *(ulong *)(lVar9 + 0x20) & 0xfffffffffffffffe;
              ppVar18 = (ppVar8->tdata_link).rbn_right_red;
              pVar23.rbt_root = ppVar18 & 0xfffffffffffffffe;
              *(prof_tdata_t **)(uVar15 + 0x18) = pVar23.rbt_root;
              (ppVar8->tdata_link).rbn_right_red = (prof_tdata_t *)((uint)ppVar18 & 1 | uVar15);
              ppVar18 = ((pVar23.rbt_root)->tdata_link).rbn_right_red;
              *(ulong *)(uVar15 + 0x18) = (ulong)ppVar18 & 0xfffffffffffffffe;
              ((pVar23.rbt_root)->tdata_link).rbn_right_red =
                   (prof_tdata_t *)((uint)ppVar18 & 1 | uVar15);
              uVar15 = (ulong)((uint)(ppVar8->tdata_link).rbn_right_red & 1);
              (ppVar8->tdata_link).rbn_right_red =
                   (prof_tdata_t *)((pVar23.rbt_root)->thread_name + (uVar15 - 0x60));
              (ppVar8->tdata_link).rbn_right_red =
                   (prof_tdata_t *)(uVar15 | (ulong)((pVar23.rbt_root)->tdata_link).rbn_left);
              ((pVar23.rbt_root)->tdata_link).rbn_left = ppVar8;
            }
            if ((rtree_ctx_t *)(puVar14 + 2) == arStack_850) goto LAB_0119ebdb;
          }
          if ((int)puVar14[1] < 0) {
            uVar15 = *puVar14;
            goto LAB_0119eb5d;
          }
          uVar15 = *puVar14;
          goto LAB_0119eb47;
        }
        ppVar8 = (prof_tdata_t *)puVar14[2];
        (ppVar8->tdata_link).rbn_left = ppVar18;
        ppVar18 = (ppVar8->tdata_link).rbn_right_red;
        if (((ulong)ppVar18 & 1) != 0) {
          ppVar18 = (prof_tdata_t *)((ulong)ppVar18 & 0xfffffffffffffffe);
          ppVar17 = (ppVar18->tdata_link).rbn_left;
          if ((ppVar17 == (prof_tdata_t *)0x0) ||
             (((ulong)(ppVar17->tdata_link).rbn_right_red & 1) == 0)) {
            ppVar17 = (prof_tdata_t *)((ulong)ppVar17 | 1);
          }
          else {
            (ppVar8->tdata_link).rbn_right_red = ppVar18;
            ppVar22 = (ppVar17->tdata_link).rbn_right_red;
            (ppVar18->tdata_link).rbn_left = (prof_tdata_t *)((ulong)ppVar22 & 0xfffffffffffffffe);
            (ppVar17->tdata_link).rbn_right_red =
                 (prof_tdata_t *)((ulong)((uint)ppVar22 & 1) | (ulong)ppVar18);
            ppVar22 = (prof_tdata_t *)
                      ((ulong)((uint)(ppVar8->tdata_link).rbn_right_red & 1) | (ulong)ppVar17);
            (ppVar8->tdata_link).rbn_right_red = ppVar22;
            ppVar18 = (prof_tdata_t *)((ulong)ppVar17 & 0xfffffffffffffffe);
            ppVar17 = (prof_tdata_t *)
                      ((ulong)((uint)ppVar22 & 1) | (ulong)(ppVar18->tdata_link).rbn_left);
          }
          (ppVar8->tdata_link).rbn_right_red = ppVar17;
          (ppVar18->tdata_link).rbn_left = ppVar8;
          if ((int)puVar14[1] < 0) {
            *(prof_tdata_t **)(*puVar14 + 0x18) = ppVar18;
            pVar23 = tdatas;
          }
          else {
            uVar15 = *puVar14;
            uVar21 = (ulong)((uint)*(undefined8 *)(uVar15 + 0x20) & 1) | (ulong)ppVar18;
LAB_0119ebbf:
            *(ulong *)(uVar15 + 0x20) = uVar21;
            pVar23 = tdatas;
          }
          goto LAB_0119ebdb;
        }
        ppVar17 = (ppVar18->tdata_link).rbn_left;
        if ((ppVar17 != (prof_tdata_t *)0x0) &&
           (ppVar22 = (ppVar17->tdata_link).rbn_right_red, ((ulong)ppVar22 & 1) != 0)) {
          ppVar22 = (prof_tdata_t *)((ulong)ppVar22 & 0xfffffffffffffffe);
          (ppVar17->tdata_link).rbn_right_red = ppVar22;
          (ppVar18->tdata_link).rbn_left = ppVar22;
          (ppVar17->tdata_link).rbn_right_red = ppVar18;
          ppVar18 = (prof_tdata_t *)
                    ((ulong)((uint)(ppVar8->tdata_link).rbn_right_red & 1) | (ulong)ppVar17);
          (ppVar8->tdata_link).rbn_right_red = ppVar18;
          pVar23.rbt_root = ppVar17 & 0xfffffffffffffffe;
          (ppVar8->tdata_link).rbn_right_red =
               (prof_tdata_t *)
               ((ulong)((uint)ppVar18 & 1) | (ulong)((pVar23.rbt_root)->tdata_link).rbn_left);
          ((pVar23.rbt_root)->tdata_link).rbn_left = ppVar8;
          if ((rtree_ctx_t *)(puVar14 + 2) != arStack_850) {
            uVar15 = *puVar14;
            if (-1 < (int)puVar14[1]) {
              uVar21 = (ulong)((uint)*(undefined8 *)(uVar15 + 0x20) & 1) | (ulong)pVar23.rbt_root;
              goto LAB_0119ebbf;
            }
            *(prof_tdata_t **)(uVar15 + 0x18) = pVar23.rbt_root;
            pVar23 = tdatas;
          }
          goto LAB_0119ebdb;
        }
        (ppVar8->tdata_link).rbn_right_red = (prof_tdata_t *)((ulong)ppVar17 | 1);
        (ppVar18->tdata_link).rbn_left = ppVar8;
        puVar14[2] = (ulong)ppVar18;
LAB_0119e94e:
        bVar26 = arStack_850 <= puVar14;
        puVar14 = puVar14 + -2;
      } while (bVar26);
    }
    tdatas.rbt_root = (prof_tdata_t *)arStack_850[0].cache[0].leafkey;
    pVar23.rbt_root = tdatas.rbt_root;
  }
  else {
    *(undefined8 *)(*(ulong *)((long)prVar12 + -0x20) + 0x18) = 0;
    pVar23 = tdatas;
  }
LAB_0119ebdb:
  tdatas.rbt_root = pVar23.rbt_root;
  duckdb_je_ckh_delete((tsd_t *)tsd_00,(ckh_t *)(lg_sample + 0x30));
  if ((tsd_t *)tsd_00 == (tsd_t *)0x0) {
    duckdb_je_rtree_ctx_data_init(arStack_850);
  }
  else {
    rtree_ctx = &((tsd_t *)tsd_00)->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar25 = (uint)(lg_sample >> 0x1e) & 0xf;
  prVar24 = (rtree_leaf_elm_t *)(lg_sample & 0xffffffffc0000000);
  uVar15 = (ulong)(uVar25 << 4);
  puVar5 = (undefined8 *)((long)&rtree_ctx->cache[0].leafkey + uVar15);
  prVar16 = *(rtree_leaf_elm_t **)((long)&rtree_ctx->cache[0].leafkey + uVar15);
  if (prVar16 == prVar24) {
    prVar16 = (rtree_leaf_elm_t *)((ulong)((uint)(lg_sample >> 9) & 0x1ffff8) + puVar5[1]);
  }
  else if ((rtree_leaf_elm_t *)rtree_ctx->l2_cache[0].leafkey == prVar24) {
    prVar10 = rtree_ctx->l2_cache[0].leaf;
    rtree_ctx->l2_cache[0].leafkey = (uintptr_t)prVar16;
    rtree_ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar5[1];
    *puVar5 = prVar24;
    puVar5[1] = prVar10;
    prVar16 = (rtree_leaf_elm_t *)
              ((long)&(prVar10->le_bits).repr + (ulong)((uint)(lg_sample >> 9) & 0x1ffff8));
  }
  else {
    prVar19 = rtree_ctx->l2_cache + 1;
    if ((rtree_leaf_elm_t *)rtree_ctx->l2_cache[1].leafkey == prVar24) {
      uVar21 = 0;
      bVar26 = false;
    }
    else {
      uVar15 = 1;
      prVar20 = prVar19;
      do {
        uVar21 = uVar15;
        bVar26 = 6 < uVar21;
        if (uVar21 == 7) goto LAB_0119eda8;
        prVar19 = prVar20 + 1;
        prVar4 = prVar20 + 1;
        uVar15 = uVar21 + 1;
        prVar20 = prVar19;
      } while ((rtree_leaf_elm_t *)prVar4->leafkey != prVar24);
      bVar26 = 6 < uVar21;
    }
    prVar10 = prVar19->leaf;
    prVar19->leafkey = rtree_ctx->l2_cache[uVar21].leafkey;
    prVar19->leaf = rtree_ctx->l2_cache[uVar21].leaf;
    rtree_ctx->l2_cache[uVar21].leafkey = (uintptr_t)prVar16;
    rtree_ctx->l2_cache[uVar21].leaf = (rtree_leaf_elm_t *)puVar5[1];
    *puVar5 = prVar24;
    puVar5[1] = prVar10;
    prVar16 = (rtree_leaf_elm_t *)
              ((long)&(prVar10->le_bits).repr + (ulong)((uint)(lg_sample >> 9) & 0x1ffff8));
LAB_0119eda8:
    if (bVar26) {
      prVar16 = duckdb_je_rtree_leaf_elm_lookup_hard
                          ((tsdn_t *)tsd_00,&duckdb_je_arena_emap_global.rtree,rtree_ctx,lg_sample,
                           true,false);
    }
  }
  pvVar7 = duckdb_je_arenas
           [*(uint *)(((long)(prVar16->le_bits).repr << 0x10) >> 0x10 & 0xffffffffffffff80) & 0xfff]
           .repr;
  if ((tsd_t *)tsd_00 == (tsd_t *)0x0) {
    duckdb_je_rtree_ctx_data_init(arStack_850);
  }
  else {
    rtree_ctx_00 = &((tsd_t *)tsd_00)->
                    cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  uVar15 = (ulong)(uVar25 << 4);
  puVar5 = (undefined8 *)((long)&rtree_ctx_00->cache[0].leafkey + uVar15);
  prVar16 = *(rtree_leaf_elm_t **)((long)&rtree_ctx_00->cache[0].leafkey + uVar15);
  if (prVar16 == prVar24) {
    prVar16 = (rtree_leaf_elm_t *)((ulong)((uint)(lg_sample >> 9) & 0x1ffff8) + puVar5[1]);
  }
  else if ((rtree_leaf_elm_t *)rtree_ctx_00->l2_cache[0].leafkey == prVar24) {
    prVar10 = rtree_ctx_00->l2_cache[0].leaf;
    rtree_ctx_00->l2_cache[0].leafkey = (uintptr_t)prVar16;
    rtree_ctx_00->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar5[1];
    *puVar5 = prVar24;
    puVar5[1] = prVar10;
    prVar16 = (rtree_leaf_elm_t *)
              ((long)&(prVar10->le_bits).repr + (ulong)((uint)(lg_sample >> 9) & 0x1ffff8));
  }
  else {
    prVar19 = rtree_ctx_00->l2_cache + 1;
    if ((rtree_leaf_elm_t *)rtree_ctx_00->l2_cache[1].leafkey == prVar24) {
      uVar21 = 0;
      bVar26 = false;
    }
    else {
      uVar15 = 1;
      prVar20 = prVar19;
      do {
        uVar21 = uVar15;
        bVar26 = 6 < uVar21;
        if (uVar21 == 7) goto LAB_0119ee2c;
        prVar19 = prVar20 + 1;
        prVar4 = prVar20 + 1;
        uVar15 = uVar21 + 1;
        prVar20 = prVar19;
      } while ((rtree_leaf_elm_t *)prVar4->leafkey != prVar24);
      bVar26 = 6 < uVar21;
    }
    prVar10 = prVar19->leaf;
    prVar19->leafkey = rtree_ctx_00->l2_cache[uVar21].leafkey;
    prVar19->leaf = rtree_ctx_00->l2_cache[uVar21].leaf;
    rtree_ctx_00->l2_cache[uVar21].leafkey = (uintptr_t)prVar16;
    rtree_ctx_00->l2_cache[uVar21].leaf = (rtree_leaf_elm_t *)puVar5[1];
    *puVar5 = prVar24;
    puVar5[1] = prVar10;
    prVar16 = (rtree_leaf_elm_t *)
              ((long)&(prVar10->le_bits).repr + (ulong)((uint)(lg_sample >> 9) & 0x1ffff8));
LAB_0119ee2c:
    if (bVar26) {
      prVar16 = duckdb_je_rtree_leaf_elm_lookup_hard
                          ((tsdn_t *)tsd_00,&duckdb_je_arena_emap_global.rtree,rtree_ctx_00,
                           lg_sample,true,false);
    }
  }
  LOCK();
  plVar3 = (long *)((long)pvVar7 + 0x48);
  *plVar3 = *plVar3 - duckdb_je_sz_index2size_tab[(ulong)(prVar16->le_bits).repr >> 0x30];
  UNLOCK();
  arena_dalloc_no_tcache((tsdn_t *)tsd_00,(void *)lg_sample);
  return;
}

Assistant:

void
prof_reset(tsd_t *tsd, size_t lg_sample) {
	prof_tdata_t *next;

	assert(lg_sample < (sizeof(uint64_t) << 3));

	malloc_mutex_lock(tsd_tsdn(tsd), &prof_dump_mtx);
	malloc_mutex_lock(tsd_tsdn(tsd), &tdatas_mtx);

	lg_prof_sample = lg_sample;
	prof_unbias_map_init();

	next = NULL;
	do {
		prof_tdata_t *to_destroy = tdata_tree_iter(&tdatas, next,
		    prof_tdata_reset_iter, (void *)tsd);
		if (to_destroy != NULL) {
			next = tdata_tree_next(&tdatas, to_destroy);
			prof_tdata_destroy_locked(tsd, to_destroy, false);
		} else {
			next = NULL;
		}
	} while (next != NULL);

	malloc_mutex_unlock(tsd_tsdn(tsd), &tdatas_mtx);
	malloc_mutex_unlock(tsd_tsdn(tsd), &prof_dump_mtx);
}